

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt.cpp
# Opt level: O3

void __thiscall
Psbt_SetOutputRecordTest_Test::~Psbt_SetOutputRecordTest_Test(Psbt_SetOutputRecordTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Psbt, SetOutputRecordTest) {
  Psbt psbt("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA=");

  HDWallet wallet1 = HDWallet(ByteData(g_psbt_seed1));
  HDWallet wallet2 = HDWallet(ByteData(g_psbt_seed2));
  std::string path1 = "44h/0h/0h/0/2";
  std::string path2 = "44h/0h/0h/0/2";
  auto key1 = wallet1.GeneratePubkeyData(NetType::kTestnet, path1);
  auto key2 = wallet2.GeneratePubkeyData(NetType::kTestnet, path2);
  auto addr1 = Address(NetType::kTestnet, WitnessVersion::kVersion0, key1.GetPubkey());
  auto addr2 = Address(NetType::kTestnet, WitnessVersion::kVersion0, key2.GetPubkey());

  std::vector<uint8_t> txout_key_bytes(34);
  std::vector<uint8_t> txout_val_bytes;
  txout_key_bytes[0] = 2;
  auto pk_bytes1 = key1.GetPubkey().GetData().GetBytes();
  auto pk_bytes2 = key2.GetPubkey().GetData().GetBytes();
  auto fp1 = key1.GetFingerprint().GetBytes();
  auto fp2 = key2.GetFingerprint().GetBytes();
  auto plist1 = key1.GetChildNumArray();
  auto plist2 = key2.GetChildNumArray();
  memcpy(&txout_key_bytes[1], pk_bytes1.data(), 33);
  txout_val_bytes.resize(4 + (plist1.size() * 4));
  memcpy(txout_val_bytes.data(), fp1.data(), 4);
  memcpy(&txout_val_bytes.data()[4], plist1.data(), 4 * plist1.size());
  ByteData txout_key1 = ByteData(txout_key_bytes);
  ByteData txout_value1 = ByteData(txout_val_bytes);

  memcpy(&txout_key_bytes[1], pk_bytes2.data(), 33);
  txout_val_bytes.resize(4 + (plist2.size() * 4));
  memcpy(txout_val_bytes.data(), fp2.data(), 4);
  memcpy(&txout_val_bytes.data()[4], plist2.data(), 4 * plist2.size());
  ByteData txout_key2 = ByteData(txout_key_bytes);
  ByteData txout_value2 = ByteData(txout_val_bytes);

  psbt.SetTxOutRecord(0, txout_key1, txout_value1);
  // EXPECT_TRUE(psbt.IsFindTxOutRecord(0, txout_key1));
  // EXPECT_FALSE(psbt.IsFindTxOutRecord(1, txout_key2));
  psbt.SetTxOutRecord(1, txout_key2, txout_value2);
  // EXPECT_TRUE(psbt.IsFindTxOutRecord(1, txout_key2));

  EXPECT_STREQ("70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a5550000000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000", psbt.GetData().GetHex().c_str());
  EXPECT_STREQ("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA=", psbt.GetBase64().c_str());

  Psbt psbt2(psbt.GetData());
  auto get_val1 = psbt2.GetTxOutKeyData(0);
  auto get_val2 = psbt2.GetTxOutKeyData(1);
  EXPECT_EQ(get_val1.ToString(), key1.ToString());
  EXPECT_EQ(get_val2.ToString(), key2.ToString());

  ByteData global_key1 = Psbt::CreateRecordKey(kProprietary, "cfd", 0, "dummy1");
  ByteData global_value1 = ByteData("01020304");
  ByteData global_key2 = Psbt::CreateRecordKey(kProprietary, "cfd", 0, "dummy2");
  ByteData global_value2 = ByteData("00");
  psbt.SetTxOutRecord(0, global_key1, global_value1);
  EXPECT_TRUE(psbt.IsFindTxOutRecord(0, global_key1));
  EXPECT_FALSE(psbt.IsFindTxOutRecord(0, global_key2));
  psbt.SetTxOutRecord(0, global_key2, global_value2);
  EXPECT_TRUE(psbt.IsFindTxOutRecord(0, global_key2));

  psbt2 = Psbt(psbt.GetData());
  auto get_gval1 = psbt2.GetTxOutRecord(0, global_key1);
  auto get_gval2 = psbt2.GetTxOutRecord(0, global_key2);
  EXPECT_EQ(get_gval1.GetHex(), global_value1.GetHex());
  EXPECT_EQ(get_gval2.GetHex(), global_value2.GetHex());

  auto key_list = psbt2.GetTxOutRecordKeyList(0);
  EXPECT_EQ(2, key_list.size());
  if (key_list.size() == 2) {
    EXPECT_EQ(global_key1.GetHex(), key_list[0].GetHex());
    EXPECT_EQ(global_key2.GetHex(), key_list[1].GetHex());
  }
  EXPECT_STREQ("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAIgIDZHSv8mM8NRhlU5+1K2K51vueTiNXZijh8KCnmTRY4GwYnWtthiwAAIAAAACAAAAAgAAAAAACAAAAAA==", psbt2.GetBase64().c_str());

  ByteData output_bip32_key1 = Psbt::CreatePubkeyRecordKey(
      Psbt::kPsbtOutputBip32Derivation, key1.GetPubkey());
  EXPECT_STREQ(
      "2a7047602c00008000000080000000800000000002000000",
      psbt2.GetTxOutRecord(0, output_bip32_key1).GetHex().c_str());
}